

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_beziervolume.cpp
# Opt level: O0

bool __thiscall ON_BezierCageMorph::Write(ON_BezierCageMorph *this,ON_BinaryArchive *archive)

{
  bool bVar1;
  bool local_19;
  bool rc;
  ON_BinaryArchive *archive_local;
  ON_BezierCageMorph *this_local;
  
  local_19 = ON_BinaryArchive::BeginWrite3dmChunk(archive,0x40008000,1,0);
  if (local_19) {
    if (local_19) {
      local_19 = ON_BinaryArchive::WriteXform(archive,&this->m_xyz2rst);
    }
    if (local_19 != false) {
      local_19 = ON_BezierCage::Write(&this->m_rst2xyz,archive);
    }
    bVar1 = ON_BinaryArchive::EndWrite3dmChunk(archive);
    if (!bVar1) {
      local_19 = false;
    }
  }
  return local_19;
}

Assistant:

bool ON_BezierCageMorph::Write(ON_BinaryArchive& archive) const
{
  bool rc = archive.BeginWrite3dmChunk(TCODE_ANONYMOUS_CHUNK,1,0);
  if (rc)
  {
    if (rc)
      rc = archive.WriteXform(m_xyz2rst);
    if(rc)
      rc = m_rst2xyz.Write(archive);
    if ( !archive.EndWrite3dmChunk() )
      rc = false;
  }
  return rc;
}